

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_cfg.cpp
# Opt level: O0

void mpp_enc_cfg_show(void)

{
  uint uVar1;
  uint uVar2;
  RK_S32 RVar3;
  MppEncCfgService *this;
  MppTrieInfo *info_00;
  CfgType *pCVar4;
  char *pcVar5;
  char *pcVar6;
  MppCfgInfo *info;
  MppTrieInfo *node;
  MppTrieInfo *root;
  MppEncCfgService *srv;
  
  this = MppEncCfgService::get();
  info_00 = MppEncCfgService::get_info_first(this);
  _mpp_log_l(4,"mpp_enc_cfg","dumping valid configure string start\n",(char *)0x0);
  for (; info_00 != (MppTrieInfo *)0x0; info_00 = MppEncCfgService::get_info_next(this,info_00)) {
    if ((*(uint *)&info_00->field_0x0 >> 0xc & 0xfff) == 0x14) {
      pCVar4 = (CfgType *)mpp_trie_info_ctx(info_00);
      pcVar5 = mpp_trie_info_name(info_00);
      pcVar6 = strof_cfg_type(*pCVar4);
      _mpp_log_l(4,"mpp_enc_cfg","%-25s type %s - %d:%d\n",(char *)0x0,pcVar5,pcVar6,pCVar4[3],
                 pCVar4[4]);
    }
    else {
      pcVar5 = mpp_trie_info_name(info_00);
      _mpp_log_l(4,"mpp_enc_cfg","%-25s size - %d\n",(char *)0x0,pcVar5,
                 (ulong)(*(uint *)&info_00->field_0x0 >> 0xc & 0xfff));
    }
  }
  _mpp_log_l(4,"mpp_enc_cfg","dumping valid configure string done\n",(char *)0x0);
  uVar1 = MppEncCfgService::get_info_count(this);
  uVar2 = MppEncCfgService::get_node_count(this);
  RVar3 = MppEncCfgService::get_info_size(this);
  _mpp_log_l(4,"mpp_enc_cfg","total cfg count %d with %d node size %d\n",(char *)0x0,(ulong)uVar1,
             (ulong)uVar2,RVar3);
  return;
}

Assistant:

void mpp_enc_cfg_show(void)
{
    MppEncCfgService *srv = MppEncCfgService::get();
    MppTrieInfo *root = srv->get_info_first();

    mpp_log("dumping valid configure string start\n");

    if (root) {
        MppTrieInfo *node = root;

        do {
            if (node->ctx_len == sizeof(MppCfgInfo)) {
                MppCfgInfo *info = (MppCfgInfo *)mpp_trie_info_ctx(node);

                mpp_log("%-25s type %s - %d:%d\n", mpp_trie_info_name(node),
                        strof_cfg_type(info->data_type), info->data_offset, info->data_size);
            } else {
                mpp_log("%-25s size - %d\n", mpp_trie_info_name(node), node->ctx_len);
            }

            node = srv->get_info_next(node);
            if (!node)
                break;
        } while (1);
    }
    mpp_log("dumping valid configure string done\n");

    mpp_log("total cfg count %d with %d node size %d\n",
            srv->get_info_count(), srv->get_node_count(), srv->get_info_size());
}